

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O2

int acmod_write_senfh_header(acmod_t *acmod,FILE *logfh)

{
  int32 iVar1;
  char *pcVar2;
  char logbasestr [64];
  char nsenstr [64];
  
  sprintf(nsenstr,"%d",(ulong)(uint)acmod->mdef->n_sen);
  logmath_get_base(acmod->lmath);
  sprintf(logbasestr,"%f");
  pcVar2 = ps_config_str(acmod->config,"mdef");
  iVar1 = bio_writehdr(logfh,"version","0.1","mdef_file",pcVar2,"n_sen",nsenstr,"logbase",logbasestr
                       ,0);
  return iVar1;
}

Assistant:

int
acmod_write_senfh_header(acmod_t *acmod, FILE *logfh)
{
    char nsenstr[64], logbasestr[64];

    sprintf(nsenstr, "%d", bin_mdef_n_sen(acmod->mdef));
    sprintf(logbasestr, "%f", logmath_get_base(acmod->lmath));
    return bio_writehdr(logfh,
                        "version", "0.1",
                        "mdef_file", ps_config_str(acmod->config, "mdef"),
                        "n_sen", nsenstr,
                        "logbase", logbasestr, NULL);
}